

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O2

GVariant * greetable_skeleton_dbus_interface_get_properties(GDBusInterfaceSkeleton *_skeleton)

{
  long lVar1;
  GType GVar2;
  gpointer user_data;
  undefined8 uVar3;
  gchar *sender;
  GDBusConnection *connection;
  GVariant *pGVar4;
  GVariant *in_RCX;
  gchar *object_path;
  long lVar5;
  GDBusPropertyInfo *info;
  GVariantBuilder builder;
  undefined1 local_b0 [128];
  
  GVar2 = greetable_skeleton_get_type();
  user_data = (gpointer)g_type_check_instance_cast(_skeleton,GVar2);
  uVar3 = g_variant_type_checked_("a{sv}");
  g_variant_builder_init(local_b0,uVar3);
  for (lVar5 = 0; (int)lVar5 != 8; lVar5 = lVar5 + 8) {
    lVar1 = *(long *)((long)_greetable_property_info_pointers + lVar5);
    if ((*(byte *)(lVar1 + 0x18) & 1) != 0) {
      sender = (gchar *)g_dbus_interface_skeleton_get_type();
      uVar3 = g_type_check_instance_cast(user_data,sender);
      g_dbus_interface_skeleton_get_connection(uVar3);
      connection = (GDBusConnection *)g_type_check_instance_cast(user_data);
      g_dbus_interface_skeleton_get_object_path();
      pGVar4 = _greetable_skeleton_handle_get_property
                         (connection,sender,object_path,(gchar *)in_RCX,*(gchar **)(lVar1 + 8),
                          (GError **)0x0,user_data);
      if (pGVar4 != (GVariant *)0x0) {
        g_variant_take_ref(pGVar4);
        in_RCX = pGVar4;
        g_variant_builder_add(local_b0,"{sv}",*(undefined8 *)(lVar1 + 8));
        g_variant_unref(pGVar4);
      }
    }
  }
  pGVar4 = (GVariant *)g_variant_builder_end(local_b0);
  return pGVar4;
}

Assistant:

static GVariant *
greetable_skeleton_dbus_interface_get_properties (GDBusInterfaceSkeleton *_skeleton)
{
  GreetableSkeleton *skeleton = GREETABLE_SKELETON (_skeleton);

  GVariantBuilder builder;
  guint n;
  g_variant_builder_init (&builder, G_VARIANT_TYPE ("a{sv}"));
  if (_greetable_interface_info.parent_struct.properties == NULL)
    goto out;
  for (n = 0; _greetable_interface_info.parent_struct.properties[n] != NULL; n++)
    {
      GDBusPropertyInfo *info = _greetable_interface_info.parent_struct.properties[n];
      if (info->flags & G_DBUS_PROPERTY_INFO_FLAGS_READABLE)
        {
          GVariant *value;
          value = _greetable_skeleton_handle_get_property (g_dbus_interface_skeleton_get_connection (G_DBUS_INTERFACE_SKELETON (skeleton)), NULL, g_dbus_interface_skeleton_get_object_path (G_DBUS_INTERFACE_SKELETON (skeleton)), "io.mangoh.Testing.Greetable", info->name, NULL, skeleton);
          if (value != NULL)
            {
              g_variant_take_ref (value);
              g_variant_builder_add (&builder, "{sv}", info->name, value);
              g_variant_unref (value);
            }
        }
    }
out:
  return g_variant_builder_end (&builder);
}